

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

int begin_set_outgoing_window(BEGIN_HANDLE begin,uint32_t outgoing_window_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  BEGIN_INSTANCE *begin_instance;
  
  if (begin == (BEGIN_HANDLE)0x0) {
    iVar2 = 0xb7d;
  }
  else {
    item_value = amqpvalue_create_uint(outgoing_window_value);
    if (item_value == (AMQP_VALUE)0x0) {
      iVar2 = 0xb85;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(begin->composite_value,3,item_value);
      iVar2 = 0xb8b;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return iVar2;
}

Assistant:

int begin_set_outgoing_window(BEGIN_HANDLE begin, uint32_t outgoing_window_value)
{
    int result;

    if (begin == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        BEGIN_INSTANCE* begin_instance = (BEGIN_INSTANCE*)begin;
        AMQP_VALUE outgoing_window_amqp_value = amqpvalue_create_uint(outgoing_window_value);
        if (outgoing_window_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(begin_instance->composite_value, 3, outgoing_window_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(outgoing_window_amqp_value);
        }
    }

    return result;
}